

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O3

void __thiscall nvim::Nvim::async_paste(Nvim *this,string *data,bool crlf,Integer phase)

{
  bool local_59;
  string local_58;
  Integer local_38;
  
  local_59 = crlf;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = phase;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"nvim_paste","");
  NvimRPC::async_call<std::__cxx11::string,bool,long>
            (&this->client_,&local_58,data,&local_59,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::async_paste(const std::string& data, bool crlf, Integer phase) {
    client_.async_call("nvim_paste", data, crlf, phase);
}